

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_max_fd_min(uint32_t fd)

{
  uint32_t fd_local;
  
  if (fio_data->max_protocol_fd <= fd) {
    fio_lock(&fio_data->lock);
    if (fio_data->max_protocol_fd < fd) {
      fio_data->max_protocol_fd = fd;
    }
    fio_unlock(&fio_data->lock);
  }
  return;
}

Assistant:

static void fio_max_fd_min(uint32_t fd) {
  if (fio_data->max_protocol_fd > fd)
    return;
  fio_lock(&fio_data->lock);
  if (fio_data->max_protocol_fd < fd)
    fio_data->max_protocol_fd = fd;
  fio_unlock(&fio_data->lock);
}